

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBufferHelper.cpp
# Opt level: O3

void __thiscall StringBufferHelper::StringBufferHelper(StringBufferHelper *this,string *buffer)

{
  (this->_buffer)._M_dataplus._M_p = (pointer)&(this->_buffer).field_2;
  (this->_buffer)._M_string_length = 0;
  (this->_buffer).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  this->_currentPosition = 0;
  return;
}

Assistant:

StringBufferHelper::StringBufferHelper(std::string buffer) {
    _buffer = buffer;
    _currentPosition = 0;
}